

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.c
# Opt level: O3

ZyanStatus
ZyanStringAppendDecS
          (ZyanString *string,ZyanI64 value,ZyanU8 padding_length,ZyanBool force_sign,
          ZyanStringView *prefix)

{
  ZyanStatus ZVar1;
  
  if (value < 0) {
    ZVar1 = ZyanStringAppend(string,&STR_SUB);
    if ((int)ZVar1 < 0) {
      return ZVar1;
    }
    if ((prefix != (ZyanStringView *)0x0) &&
       (ZVar1 = ZyanStringAppend(string,prefix), (int)ZVar1 < 0)) {
      return ZVar1;
    }
    value = -value;
  }
  else if (((force_sign != '\0') && (ZVar1 = ZyanStringAppend(string,&STR_ADD), (int)ZVar1 < 0)) ||
          ((prefix != (ZyanStringView *)0x0 &&
           (ZVar1 = ZyanStringAppend(string,prefix), (int)ZVar1 < 0)))) {
    return ZVar1;
  }
  ZVar1 = ZyanStringAppendDecU64(string,value,padding_length);
  return ZVar1;
}

Assistant:

ZyanStatus ZyanStringAppendDecS(ZyanString* string, ZyanI64 value, ZyanU8 padding_length,
    ZyanBool force_sign, const ZyanStringView* prefix)
{
    if (value < 0)
    {
        ZYAN_CHECK(ZyanStringAppend(string, &STR_SUB));
        if (prefix)
        {
            ZYAN_CHECK(ZyanStringAppend(string, prefix));
        }
        return ZyanStringAppendDecU(string, ZyanAbsI64(value), padding_length);
    }

    if (force_sign)
    {
        ZYAN_ASSERT(value >= 0);
        ZYAN_CHECK(ZyanStringAppend(string, &STR_ADD));
    }

    if (prefix)
    {
        ZYAN_CHECK(ZyanStringAppend(string, prefix));
    }
    return ZyanStringAppendDecU(string, value, padding_length);
}